

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O2

string * vimEditCommand(string *__return_storage_ptr__,string *path,
                       optional<std::pair<int,_int>_> location,string *vimArgs)

{
  string prefix;
  string col;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_f0,"eval \'$EDITOR ",vimArgs);
  std::operator+(&local_d0,&local_f0,"\\\"");
  std::operator+(&local_b0,&local_d0,path);
  std::operator+(&local_110,&local_b0,"\\\"");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
            (&local_b0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
            (&local_d0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
            (&local_f0);
  if (((undefined1  [12])
       location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
       super__Optional_payload_base<std::pair<int,_int>_> & (undefined1  [12])0x1) ==
      (undefined1  [12])0x0) {
    std::operator+(__return_storage_ptr__,&local_110,"\'");
  }
  else {
    std::__cxx11::to_string
              (&local_b0,
               location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
               super__Optional_payload_base<std::pair<int,_int>_>._M_payload._0_4_);
    std::__cxx11::to_string
              (&local_d0,
               location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
               super__Optional_payload_base<std::pair<int,_int>_>._M_payload._4_4_);
    std::operator+(&local_90,&local_110," \\\"+call cursor(");
    std::operator+(&local_70,&local_90,&local_b0);
    std::operator+(&local_50,&local_70,", ");
    std::operator+(&local_f0,&local_50,&local_d0);
    std::operator+(__return_storage_ptr__,&local_f0,")\\\"\'");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
              (&local_f0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
              (&local_50);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
              (&local_70);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
              (&local_90);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
              (&local_d0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
              (&local_b0);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
            (&local_110);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] static std::string
vimEditCommand(const std::string &path,
               std::optional<std::pair<int, int>> location,
               const std::string &vimArgs = "") {
  const std::string prefix =
      "eval '$EDITOR " + vimArgs + "\\\"" + path + "\\\"";
  if (location) {
    let line = std::to_string(std::get<0>(*location));
    let col = std::to_string(std::get<1>(*location));
    return prefix + " \\\"+call cursor(" + line + ", " + col + ")\\\"'";
  }

  return prefix + "'";
}